

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::DatagramReceiver> * __thiscall
kj::Own<kj::DatagramReceiver>::operator=
          (Own<kj::DatagramReceiver> *this,Own<kj::DatagramReceiver> *other)

{
  DatagramReceiver *object;
  Dispose_<kj::DatagramReceiver,_true> *this_00;
  DatagramReceiver *pDVar1;
  Disposer *in_RDX;
  
  object = (DatagramReceiver *)this->disposer;
  this_00 = (Dispose_<kj::DatagramReceiver,_true> *)this->ptr;
  pDVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pDVar1;
  other->ptr = (DatagramReceiver *)0x0;
  if (this_00 != (Dispose_<kj::DatagramReceiver,_true> *)0x0) {
    Disposer::Dispose_<kj::DatagramReceiver,_true>::dispose(this_00,object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }